

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O3

void init_descriptor(int control)

{
  bool bVar1;
  int __fd;
  int iVar2;
  DESCRIPTOR_DATA *d;
  char *pcVar3;
  int *piVar4;
  hostent *phVar5;
  size_t sVar6;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  int size;
  sockaddr_in sock;
  char buf [4608];
  socklen_t local_1248;
  uint local_1244;
  uint local_1240;
  uint local_123c;
  sockaddr local_1238;
  undefined8 local_1228;
  
  local_1248 = 0x10;
  getsockname(control,&local_1238,&local_1248);
  __fd = accept(control,&local_1238,&local_1248);
  if (__fd < 0) {
    piVar4 = __errno_location();
    local_1228 = strerror(*piVar4);
    pcVar3 = "Init_descriptor: accept: {}";
    sVar6 = 0x1b;
LAB_00273e4c:
    fmt_01._M_str = pcVar3;
    fmt_01._M_len = sVar6;
    CLogger::Warn<char*>((CLogger *)&RS.field_0x140,fmt_01,(char **)&local_1228);
    return;
  }
  iVar2 = fcntl(__fd,4,0x800);
  if ((iVar2 == -1) || (iVar2 = fcntl(__fd,4,0x800), iVar2 == -1)) {
    piVar4 = __errno_location();
    local_1228 = strerror(*piVar4);
    pcVar3 = "Init_descriptor: fcntl FNDELAY: {}";
    sVar6 = 0x22;
    goto LAB_00273e4c;
  }
  d = new_descriptor();
  d->descriptor = (short)__fd;
  d->connected = 1;
  d->showstr_head = (char *)0x0;
  d->showstr_point = (char *)0x0;
  d->outsize = 2000;
  d->pEdit = (void *)0x0;
  d->pString = (char **)0x0;
  d->editor = 0;
  pcVar3 = (char *)operator_new__(2000);
  d->outbuf = pcVar3;
  d->outtop = 0;
  local_1248 = 0x10;
  iVar2 = getpeername(__fd,&local_1238,&local_1248);
  if (iVar2 < 0) {
    piVar4 = __errno_location();
    local_1228 = strerror(*piVar4);
    fmt_02._M_str = "Init_descriptor: getpeername: {}";
    fmt_02._M_len = 0x20;
    CLogger::Warn<char*>((CLogger *)&RS.field_0x140,fmt_02,(char **)&local_1228);
    pcVar3 = palloc_string("(unknown)");
    d->host = pcVar3;
    iVar2 = (int)d->type;
  }
  else {
    local_1244 = (uint)local_1238.sa_data._2_4_ >> 0x18;
    local_1228 = (char *)(CONCAT44(local_1228._4_4_,local_1238.sa_data._2_4_) & 0xffffffff000000ff);
    local_123c = ((local_1238.sa_data._2_4_ & 0xff00) << 8) >> 0x10;
    local_1240 = (local_1238.sa_data._2_4_ & 0xff0000) >> 0x10;
    fmt._M_str = "Sock.sinaddr:  {}.{}.{}.{}";
    fmt._M_len = 0x1a;
    CLogger::Info<int,int,int,int>
              ((CLogger *)&RS.field_0x140,fmt,(int *)&local_1228,(int *)&local_123c,
               (int *)&local_1240,(int *)&local_1244);
    pcVar3 = strstr((char *)&local_1228,"204.82.56.");
    if (pcVar3 != (char *)0x0) {
      fmt_00._M_str = "DNS lookup refused. Forbidding access.";
      fmt_00._M_len = 0x26;
      CLogger::Info<>((CLogger *)&RS.field_0x140,fmt_00);
      pcVar3 = "Your site has been banned from this mud due to DNS problems.\n\r";
      goto LAB_00273f0f;
    }
    phVar5 = gethostbyaddr(local_1238.sa_data + 2,4,2);
    if (phVar5 == (hostent *)0x0) {
      pcVar3 = palloc_string((char *)&local_1228);
      d->host = pcVar3;
      d->type = 1;
      iVar2 = 1;
    }
    else {
      pcVar3 = palloc_string(phVar5->h_name);
      d->host = pcVar3;
      d->type = 0;
      iVar2 = 0;
    }
  }
  bVar1 = check_ban(pcVar3,0,iVar2);
  if (!bVar1) {
    d->next = descriptor_list;
    pcVar3 = help_greeting;
    if (*help_greeting == '.') {
      pcVar3 = help_greeting + 1;
    }
    descriptor_list = d;
    write_to_buffer(d,pcVar3,0);
    return;
  }
  pcVar3 = "Your site has been banned from this mud.\n\r";
LAB_00273f0f:
  write_to_descriptor(__fd,pcVar3,0);
  close(__fd);
  free_descriptor(d);
  return;
}

Assistant:

void init_descriptor(int control)
{
	char buf[MAX_STRING_LENGTH];
	DESCRIPTOR_DATA *dnew;
	struct sockaddr_in sock;
	struct hostent *from;
	int desc;
	int size;

	size = sizeof(sock);
	getsockname(control, (struct sockaddr *)&sock, (socklen_t *)&size);

	if ((desc = accept(control, (struct sockaddr *)&sock, (socklen_t *)&size)) < 0)
	{
		RS.Logger.Warn("Init_descriptor: accept: {}", std::strerror(errno));
		return;
	}

	if (fcntl(desc, F_SETFL, FNDELAY) == -1)
	{
		RS.Logger.Warn("Init_descriptor: fcntl FNDELAY: {}", std::strerror(errno));
		return;
	}

#ifndef _WIN32  /* windows doesn't lock files like this so we should be able to bypass */
	if (fcntl(desc, F_SETFL, FNDELAY) == -1)
	{
		RS.Logger.Warn("Init_descriptor: fcntl FNDELAY: {}", std::strerror(errno));
		return;
	}
#endif

	/*
	 * Cons a new descriptor.
	 */
	dnew = new_descriptor();
	dnew->descriptor = desc;
	dnew->connected = CON_GET_NAME;
	dnew->showstr_head = nullptr;
	dnew->showstr_point = nullptr;
	dnew->outsize = 2000;
	dnew->pEdit = nullptr;	  /* OLC */
	dnew->pString = nullptr; /* OLC */
	dnew->editor = 0;	  /* OLC */
	dnew->outbuf = new char[dnew->outsize];
	dnew->outtop = 0;

	size = sizeof(sock);

	if (getpeername(desc, (struct sockaddr *)&sock, (socklen_t *)&size) < 0)
	{
		RS.Logger.Warn("Init_descriptor: getpeername: {}", std::strerror(errno));
		dnew->host = palloc_string("(unknown)");
	}
	else
	{
		/*
		 * Would be nice to use inet_ntoa here but it takes a struct arg,
		 * which ain't very compatible between gcc and system libraries.
		 */
		int addr;

		addr = ntohl(sock.sin_addr.s_addr);

		RS.Logger.Info("Sock.sinaddr:  {}.{}.{}.{}", (addr >> 24) & 0xFF, (addr >> 16) & 0xFF, (addr >> 8) & 0xFF, (addr)&0xFF);

		if (strstr(buf, "204.82.56."))
		{
			RS.Logger.Info("DNS lookup refused. Forbidding access.");
			write_to_descriptor(desc, "Your site has been banned from this mud due to DNS problems.\n\r", 0);

			close(desc);
			free_descriptor(dnew);
			return;
		}

		if ((from = gethostbyaddr((char *)&sock.sin_addr, sizeof(sock.sin_addr), AF_INET)) != nullptr)
		{
			dnew->host = palloc_string(from->h_name);
			dnew->type = 0;
		}
		else
		{
			dnew->host = palloc_string(buf);
			dnew->type = 1;
		}
	}

	/*
	 * Swiftest: I added the following to ban sites.  I don't
	 * endorse banning of sites, but Copper has few descriptors now
	 * and some people from certain sites keep abusing access by
	 * using automated 'autodialers' and leaving connections hanging.
	 *
	 * Furey: added suffix check by request of Nickel of HiddenWorlds.
	 */
	if (check_ban(dnew->host, NBAN_ALL, dnew->type))
	{
		write_to_descriptor(desc, "Your site has been banned from this mud.\n\r", 0);

		close(desc);
		free_descriptor(dnew);
		return;
	}
	/*
	 * Init descriptor data.
	 */
	dnew->next = descriptor_list;
	descriptor_list = dnew;

	/*
	 * Send the greeting.
	 */
	{
		if (help_greeting[0] == '.')
			write_to_buffer(dnew, help_greeting + 1, 0);
		else
			write_to_buffer(dnew, help_greeting, 0);
	}
}